

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall DPlayerMenu::UpdateColorsets(DPlayerMenu *this)

{
  PClassPlayerPawn *this_00;
  FListMenuItem *pFVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  FPlayerColorSet *this_01;
  char *pcVar5;
  uint local_38;
  uint i_1;
  int mycolorset;
  FPlayerColorSet *colorset;
  uint local_20;
  uint i;
  int sel;
  FListMenuItem *li;
  DPlayerMenu *this_local;
  
  li = (FListMenuItem *)this;
  FName::FName((FName *)&i,NAME_Color);
  _sel = DListMenu::GetItem(&this->super_DListMenu,(FName *)&i);
  if (_sel != (FListMenuItem *)0x0) {
    local_20 = 0;
    PClassPlayerPawn::EnumColorSets(this->PlayerClass->Type,&this->PlayerColorSets);
    (*_sel->_vptr_FListMenuItem[8])(_sel,0,"Custom");
    for (colorset._4_4_ = 0; uVar2 = TArray<int,_int>::Size(&this->PlayerColorSets),
        colorset._4_4_ < uVar2; colorset._4_4_ = colorset._4_4_ + 1) {
      this_00 = this->PlayerClass->Type;
      piVar4 = TArray<int,_int>::operator[](&this->PlayerColorSets,(ulong)colorset._4_4_);
      this_01 = PClassPlayerPawn::GetColorSet(this_00,*piVar4);
      pFVar1 = _sel;
      pcVar5 = FName::operator_cast_to_char_(&this_01->Name);
      (*pFVar1->_vptr_FListMenuItem[8])(pFVar1,(ulong)(colorset._4_4_ + 1),pcVar5);
    }
    iVar3 = userinfo_t::GetColorSet((userinfo_t *)((long)consoleplayer * 0x2a0 + 0xd63498));
    if (iVar3 != -1) {
      for (local_38 = 0; uVar2 = TArray<int,_int>::Size(&this->PlayerColorSets), local_38 < uVar2;
          local_38 = local_38 + 1) {
        piVar4 = TArray<int,_int>::operator[](&this->PlayerColorSets,(ulong)local_38);
        if (*piVar4 == iVar3) {
          local_20 = local_38 + 1;
        }
      }
    }
    (*_sel->_vptr_FListMenuItem[10])(_sel,0,(ulong)local_20);
  }
  return;
}

Assistant:

void DPlayerMenu::UpdateColorsets()
{
	FListMenuItem *li = GetItem(NAME_Color);
	if (li != NULL)
	{
		int sel = 0;
		PlayerClass->Type->EnumColorSets(&PlayerColorSets);
		li->SetString(0, "Custom");
		for(unsigned i=0;i<PlayerColorSets.Size(); i++)
		{
			FPlayerColorSet *colorset = PlayerClass->Type->GetColorSet(PlayerColorSets[i]);
			li->SetString(i+1, colorset->Name);
		}
		int mycolorset = players[consoleplayer].userinfo.GetColorSet();
		if (mycolorset != -1)
		{
			for(unsigned i=0;i<PlayerColorSets.Size(); i++)
			{
				if (PlayerColorSets[i] == mycolorset)
				{
					sel = i+1;
				}
			}
		}
		li->SetValue(0, sel);
	}
}